

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::ignore_underscore(string *item)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  string *str;
  
  this = in_RDI;
  str = in_RDI;
  ::std::__cxx11::string::string(in_RSI,in_stack_ffffffffffffffe8);
  detail::remove_underscore(str);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  return in_RDI;
}

Assistant:

inline std::string ignore_underscore(std::string item) { return detail::remove_underscore(item); }